

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diners.c
# Opt level: O2

dining_policy_t get_dining_policy(void)

{
  int iVar1;
  dining_policy_t dVar2;
  char *__s1;
  
  __s1 = getenv("DINING_POLICY");
  if (__s1 == (char *)0x0) {
    dVar2 = NO_FORK_REORDERING;
  }
  else {
    iVar1 = strcmp(__s1,"avoid_deadlock");
    dVar2 = (dining_policy_t)(iVar1 == 0);
  }
  return dVar2;
}

Assistant:

enum dining_policy_t get_dining_policy()
{
    char *dining_policy = getenv("DINING_POLICY");
    if (dining_policy == NULL)
        return NO_FORK_REORDERING;

    if (strcmp(dining_policy, "avoid_deadlock") == 0)
        return FORK_REORDERING;

    return NO_FORK_REORDERING;
}